

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void __thiscall
DnsStats::SubmitQueryExtensions
          (DnsStats *this,uint8_t *packet,uint32_t length,uint32_t name_offset,uint8_t *client_addr,
          size_t client_addr_length)

{
  uint8_t *domain;
  bool bVar1;
  ulong uVar2;
  TldAsKey *pTVar3;
  ulong length_00;
  bool is_bad_syntax;
  bool is_numeric;
  bool is_binary;
  uint32_t tld_offset;
  uint32_t previous_offset;
  int nb_name_parts;
  TldAsKey key;
  bool local_b7;
  bool local_b6;
  bool local_b5;
  uint32_t local_b4;
  size_t local_b0;
  uint32_t local_a8 [2];
  TldAsKey local_a0;
  
  local_b4 = 0;
  local_a8[1] = 0;
  local_a8[0] = 0;
  bVar1 = GetTLD(packet,length,name_offset,&local_b4,local_a8,(int *)(local_a8 + 1));
  if (bVar1) {
    local_b5 = false;
    local_b7 = false;
    local_b6 = false;
    domain = packet + (ulong)local_b4 + 1;
    length_00 = (ulong)domain[-1];
    local_b0 = client_addr_length;
    TldCheck(domain,length_00,&local_b5,&local_b7,&local_b6);
    if ((local_b5 == false) && (local_b7 == false)) {
      if (length_00 != 0) {
        uVar2 = 0;
        do {
          if ((byte)(domain[uVar2] + 0x9f) < 0x1a) {
            domain[uVar2] = domain[uVar2] + 0xe0;
          }
          uVar2 = uVar2 + 1;
        } while (length_00 != uVar2);
      }
      TldAsKey::TldAsKey(&local_a0,domain,length_00);
      if ((this->registeredTld).tableCount == 0) {
        LoadRegisteredTLD_from_memory(this);
      }
      pTVar3 = BinHash<TldAsKey>::Retrieve(&this->registeredTld,&local_a0);
      if (pTVar3 != (TldAsKey *)0x0) {
        RegisterOptionsByIp(this,client_addr,local_b0);
      }
      TldAsKey::~TldAsKey(&local_a0);
    }
  }
  return;
}

Assistant:

void DnsStats::SubmitQueryExtensions(
    uint8_t* packet, uint32_t length, uint32_t name_offset,
    uint8_t* client_addr, size_t client_addr_length)
{
    uint32_t tld_offset = 0;
    int nb_name_parts = 0;
    uint32_t previous_offset = 0;
    bool gotTld = GetTLD(packet, length, name_offset, &tld_offset, &previous_offset, &nb_name_parts);

    if (gotTld)
    {
        bool is_binary = false;
        bool is_bad_syntax = false;
        bool is_numeric = false;

        /* Verify that the TLD is valid, so as to exclude random traffic that would drown the stats */
        TldCheck(packet + tld_offset + 1, packet[tld_offset], &is_binary, &is_bad_syntax, &is_numeric);

        if (!is_binary && !is_bad_syntax) {
            SetToUpperCase(packet + tld_offset + 1, packet[tld_offset]);
            TldAsKey key(packet + tld_offset + 1, packet[tld_offset]);

            if (registeredTld.GetCount() == 0)
            {
                LoadRegisteredTLD_from_memory();
            }

            if (registeredTld.Retrieve(&key) != NULL)
            {
                /* This is a registered TLD
                 * Use the list of source addresses as a filter to
                 * check the incoming EDNS options */
                RegisterOptionsByIp(client_addr, client_addr_length);
            }
        }
    }
}